

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  float *pfVar4;
  undefined4 uVar5;
  Scene *pSVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  byte bVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  NodeRef *pNVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  float fVar33;
  uint uVar34;
  float fVar37;
  float fVar39;
  vint4 bi;
  uint uVar38;
  uint uVar40;
  float fVar41;
  uint uVar42;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar43;
  float fVar53;
  float fVar57;
  vint4 ai;
  uint uVar44;
  uint uVar45;
  float fVar46;
  uint uVar54;
  uint uVar55;
  float fVar56;
  uint uVar58;
  uint uVar59;
  float fVar60;
  uint uVar61;
  uint uVar62;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  uint uVar63;
  float fVar64;
  float fVar65;
  uint uVar68;
  uint uVar71;
  vint4 ai_1;
  float fVar69;
  float fVar70;
  float fVar72;
  uint uVar73;
  float fVar74;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar78;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar88;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  int iVar94;
  float fVar95;
  int iVar96;
  float fVar97;
  int iVar98;
  float fVar99;
  int iVar100;
  int iVar101;
  int iVar102;
  int iVar103;
  float fVar104;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar105 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  float fStack_ae4;
  float fStack_ad4;
  undefined1 local_ac8 [16];
  undefined1 (*local_ab0) [16];
  undefined8 local_aa8;
  float fStack_aa0;
  float fStack_a9c;
  undefined8 local_a98;
  float fStack_a90;
  float fStack_a8c;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  float local_a68;
  undefined4 uStack_a64;
  undefined4 uStack_a60;
  undefined4 uStack_a5c;
  undefined1 (*local_a50) [16];
  RTCFilterFunctionNArguments args;
  undefined8 local_a18;
  undefined8 uStack_a10;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  float local_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float local_9e8;
  float fStack_9e4;
  float fStack_9e0;
  float fStack_9dc;
  undefined1 local_9d8 [8];
  float fStack_9d0;
  float fStack_9cc;
  float local_9c8;
  float fStack_9c4;
  float fStack_9c0;
  float fStack_9bc;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  float local_9a8;
  float fStack_9a4;
  float fStack_9a0;
  float fStack_99c;
  undefined1 local_998 [16];
  undefined1 local_988 [16];
  undefined1 local_978 [16];
  float local_968 [4];
  float local_958 [4];
  undefined8 local_948;
  undefined8 uStack_940;
  float local_938 [4];
  undefined1 local_928 [16];
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  undefined4 local_908;
  undefined4 uStack_904;
  undefined4 uStack_900;
  undefined4 uStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  undefined4 local_8e8;
  undefined4 uStack_8e4;
  undefined4 uStack_8e0;
  undefined4 uStack_8dc;
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  uint local_8b8;
  uint uStack_8b4;
  uint uStack_8b0;
  uint uStack_8ac;
  uint local_8a8;
  uint uStack_8a4;
  uint uStack_8a0;
  uint uStack_89c;
  uint local_898;
  uint uStack_894;
  uint uStack_890;
  uint uStack_88c;
  undefined1 local_888 [16];
  undefined8 local_878;
  undefined8 uStack_870;
  int local_868;
  int iStack_864;
  int iStack_860;
  int iStack_85c;
  int local_858;
  int iStack_854;
  int iStack_850;
  int iStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  NodeRef stack [244];
  
  local_a78 = stack + 1;
  stack[0] = root;
  local_7f8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_808 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_818 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_828 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_838 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_848 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_a88 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar29 = local_a88 ^ 0x10;
  local_858 = (tray->tnear).field_0.i[k];
  local_868 = (tray->tfar).field_0.i[k];
  local_878 = mm_lookupmask_ps._0_8_;
  uStack_870 = mm_lookupmask_ps._8_8_;
  local_888 = mm_lookupmask_ps._240_16_;
  local_ab0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar32 = true;
  fStack_7f4 = local_7f8;
  fStack_7f0 = local_7f8;
  fStack_7ec = local_7f8;
  fStack_804 = local_808;
  fStack_800 = local_808;
  fStack_7fc = local_808;
  fStack_814 = local_818;
  fStack_810 = local_818;
  fStack_80c = local_818;
  fStack_824 = local_828;
  fStack_820 = local_828;
  fStack_81c = local_828;
  fStack_834 = local_838;
  fStack_830 = local_838;
  fStack_82c = local_838;
  fStack_844 = local_848;
  fStack_840 = local_848;
  fStack_83c = local_848;
  iStack_854 = local_858;
  iStack_850 = local_858;
  iStack_84c = local_858;
  iStack_864 = local_868;
  iStack_860 = local_868;
  iStack_85c = local_868;
  fVar65 = local_808;
  fVar70 = local_808;
  fVar78 = local_808;
  fVar121 = local_808;
  fVar122 = local_818;
  fVar123 = local_818;
  fVar124 = local_818;
  fVar64 = local_818;
  fVar69 = local_828;
  fVar72 = local_828;
  fVar74 = local_828;
  fVar113 = local_828;
  fVar114 = local_848;
  fVar115 = local_848;
  fVar116 = local_848;
  fVar46 = local_848;
  iVar21 = local_858;
  iVar94 = local_858;
  iVar96 = local_858;
  iVar98 = local_858;
  iVar100 = local_868;
  iVar101 = local_868;
  iVar102 = local_868;
  iVar103 = local_868;
  fVar56 = local_7f8;
  fVar79 = local_7f8;
  fVar80 = local_7f8;
  fVar81 = local_7f8;
  fVar82 = local_838;
  fVar83 = local_838;
  fVar84 = local_838;
  fVar85 = local_838;
  local_a50 = local_ab0;
LAB_00267039:
  do {
    uVar30 = local_a78[-1].ptr;
    local_a78 = local_a78 + -1;
    while ((uVar30 & 8) == 0) {
      pfVar1 = (float *)(uVar30 + 0x20 + local_a88);
      fVar33 = (*pfVar1 - fVar56) * fVar69;
      fVar37 = (pfVar1[1] - fVar79) * fVar72;
      fVar39 = (pfVar1[2] - fVar80) * fVar74;
      fVar41 = (pfVar1[3] - fVar81) * fVar113;
      pfVar1 = (float *)(uVar30 + 0x20 + uVar25);
      fVar43 = (*pfVar1 - fVar65) * fVar82;
      fVar53 = (pfVar1[1] - fVar70) * fVar83;
      fVar57 = (pfVar1[2] - fVar78) * fVar84;
      fVar60 = (pfVar1[3] - fVar121) * fVar85;
      uVar44 = (uint)((int)fVar43 < (int)fVar33) * (int)fVar33 |
               (uint)((int)fVar43 >= (int)fVar33) * (int)fVar43;
      uVar54 = (uint)((int)fVar53 < (int)fVar37) * (int)fVar37 |
               (uint)((int)fVar53 >= (int)fVar37) * (int)fVar53;
      uVar58 = (uint)((int)fVar57 < (int)fVar39) * (int)fVar39 |
               (uint)((int)fVar57 >= (int)fVar39) * (int)fVar57;
      uVar61 = (uint)((int)fVar60 < (int)fVar41) * (int)fVar41 |
               (uint)((int)fVar60 >= (int)fVar41) * (int)fVar60;
      pfVar1 = (float *)(uVar30 + 0x20 + uVar31);
      fVar33 = (*pfVar1 - fVar122) * fVar114;
      fVar37 = (pfVar1[1] - fVar123) * fVar115;
      fVar39 = (pfVar1[2] - fVar124) * fVar116;
      fVar41 = (pfVar1[3] - fVar64) * fVar46;
      uVar34 = (uint)((int)fVar33 < iVar21) * iVar21 | (uint)((int)fVar33 >= iVar21) * (int)fVar33;
      uVar38 = (uint)((int)fVar37 < iVar94) * iVar94 | (uint)((int)fVar37 >= iVar94) * (int)fVar37;
      uVar40 = (uint)((int)fVar39 < iVar96) * iVar96 | (uint)((int)fVar39 >= iVar96) * (int)fVar39;
      uVar42 = (uint)((int)fVar41 < iVar98) * iVar98 | (uint)((int)fVar41 >= iVar98) * (int)fVar41;
      pfVar1 = (float *)(uVar30 + 0x20 + uVar29);
      fVar33 = (*pfVar1 - fVar56) * fVar69;
      fVar37 = (pfVar1[1] - fVar79) * fVar72;
      fVar39 = (pfVar1[2] - fVar80) * fVar74;
      fVar41 = (pfVar1[3] - fVar81) * fVar113;
      pfVar1 = (float *)(uVar30 + 0x20 + (uVar25 ^ 0x10));
      fVar43 = (*pfVar1 - fVar65) * fVar82;
      fVar53 = (pfVar1[1] - fVar70) * fVar83;
      fVar57 = (pfVar1[2] - fVar78) * fVar84;
      fVar60 = (pfVar1[3] - fVar121) * fVar85;
      uVar63 = (uint)((int)fVar33 < (int)fVar43) * (int)fVar33 |
               (uint)((int)fVar33 >= (int)fVar43) * (int)fVar43;
      uVar68 = (uint)((int)fVar37 < (int)fVar53) * (int)fVar37 |
               (uint)((int)fVar37 >= (int)fVar53) * (int)fVar53;
      uVar71 = (uint)((int)fVar39 < (int)fVar57) * (int)fVar39 |
               (uint)((int)fVar39 >= (int)fVar57) * (int)fVar57;
      uVar73 = (uint)((int)fVar41 < (int)fVar60) * (int)fVar41 |
               (uint)((int)fVar41 >= (int)fVar60) * (int)fVar60;
      pfVar1 = (float *)(uVar30 + 0x20 + (uVar31 ^ 0x10));
      fVar33 = (*pfVar1 - fVar122) * fVar114;
      fVar37 = (pfVar1[1] - fVar123) * fVar115;
      fVar39 = (pfVar1[2] - fVar124) * fVar116;
      fVar41 = (pfVar1[3] - fVar64) * fVar46;
      uVar45 = (uint)(iVar100 < (int)fVar33) * iVar100 |
               (uint)(iVar100 >= (int)fVar33) * (int)fVar33;
      uVar55 = (uint)(iVar101 < (int)fVar37) * iVar101 |
               (uint)(iVar101 >= (int)fVar37) * (int)fVar37;
      uVar59 = (uint)(iVar102 < (int)fVar39) * iVar102 |
               (uint)(iVar102 >= (int)fVar39) * (int)fVar39;
      uVar62 = (uint)(iVar103 < (int)fVar41) * iVar103 |
               (uint)(iVar103 >= (int)fVar41) * (int)fVar41;
      auVar50._0_4_ =
           -(uint)((int)(((int)uVar63 < (int)uVar45) * uVar63 |
                        ((int)uVar63 >= (int)uVar45) * uVar45) <
                  (int)(((int)uVar34 < (int)uVar44) * uVar44 | ((int)uVar34 >= (int)uVar44) * uVar34
                       ));
      auVar50._4_4_ =
           -(uint)((int)(((int)uVar68 < (int)uVar55) * uVar68 |
                        ((int)uVar68 >= (int)uVar55) * uVar55) <
                  (int)(((int)uVar38 < (int)uVar54) * uVar54 | ((int)uVar38 >= (int)uVar54) * uVar38
                       ));
      auVar50._8_4_ =
           -(uint)((int)(((int)uVar71 < (int)uVar59) * uVar71 |
                        ((int)uVar71 >= (int)uVar59) * uVar59) <
                  (int)(((int)uVar40 < (int)uVar58) * uVar58 | ((int)uVar40 >= (int)uVar58) * uVar40
                       ));
      auVar50._12_4_ =
           -(uint)((int)(((int)uVar73 < (int)uVar62) * uVar73 |
                        ((int)uVar73 >= (int)uVar62) * uVar62) <
                  (int)(((int)uVar42 < (int)uVar61) * uVar61 | ((int)uVar42 >= (int)uVar61) * uVar42
                       ));
      uVar34 = movmskps((int)local_ab0,auVar50);
      local_ab0 = (undefined1 (*) [16])(ulong)uVar34;
      if (uVar34 == 0xf) {
        bVar32 = local_a78 != stack;
        if (!bVar32) {
          return bVar32;
        }
        goto LAB_00267039;
      }
      bVar24 = (byte)uVar34 ^ 0xf;
      uVar22 = uVar30 & 0xfffffffffffffff0;
      lVar27 = 0;
      if (bVar24 != 0) {
        for (; (bVar24 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
        }
      }
      uVar30 = *(ulong *)(uVar22 + lVar27 * 8);
      uVar34 = bVar24 - 1 & (uint)bVar24;
      local_ab0 = (undefined1 (*) [16])(ulong)uVar34;
      if (uVar34 != 0) {
        local_a78->ptr = uVar30;
        local_a78 = local_a78 + 1;
        lVar27 = 0;
        if (local_ab0 != (undefined1 (*) [16])0x0) {
          for (; (uVar34 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
          }
        }
        uVar30 = *(ulong *)(uVar22 + lVar27 * 8);
        uVar34 = uVar34 - 1 & uVar34;
        uVar26 = (ulong)uVar34;
        if (uVar34 != 0) {
          do {
            local_a78->ptr = uVar30;
            local_a78 = local_a78 + 1;
            local_ab0 = (undefined1 (*) [16])0x0;
            if (uVar26 != 0) {
              for (; (uVar26 >> (long)local_ab0 & 1) == 0;
                  local_ab0 = (undefined1 (*) [16])(*local_ab0 + 1)) {
              }
            }
            uVar30 = *(ulong *)(uVar22 + (long)local_ab0 * 8);
            uVar26 = uVar26 & uVar26 - 1;
          } while (uVar26 != 0);
        }
      }
    }
    local_a98 = (ulong)((uint)uVar30 & 0xf) - 8;
    if (local_a98 != 0) {
      uVar30 = uVar30 & 0xfffffffffffffff0;
      lVar27 = 0;
      do {
        lVar23 = lVar27 * 0xe0;
        puVar2 = (undefined8 *)(uVar30 + 0xd0 + lVar23);
        local_a18 = *puVar2;
        uStack_a10 = puVar2[1];
        pfVar1 = (float *)(uVar30 + lVar23);
        fVar121 = *pfVar1;
        fVar122 = pfVar1[1];
        fVar123 = pfVar1[2];
        fVar124 = pfVar1[3];
        pfVar1 = (float *)(uVar30 + 0x10 + lVar23);
        fVar64 = *pfVar1;
        fVar69 = pfVar1[1];
        fVar72 = pfVar1[2];
        fVar74 = pfVar1[3];
        pfVar1 = (float *)(uVar30 + 0x20 + lVar23);
        fVar113 = *pfVar1;
        fVar114 = pfVar1[1];
        fVar115 = pfVar1[2];
        fVar116 = pfVar1[3];
        pfVar1 = (float *)(uVar30 + 0x40 + lVar23);
        local_b08 = *(undefined8 *)pfVar1;
        uStack_b00 = *(undefined8 *)(pfVar1 + 2);
        fVar93 = fVar64 - *pfVar1;
        fVar95 = fVar69 - pfVar1[1];
        fVar97 = fVar72 - pfVar1[2];
        fVar99 = fVar74 - pfVar1[3];
        pfVar1 = (float *)(uVar30 + 0x50 + lVar23);
        local_b18 = *(undefined8 *)pfVar1;
        uStack_b10 = *(undefined8 *)(pfVar1 + 2);
        fVar37 = fVar113 - *pfVar1;
        fVar41 = fVar114 - pfVar1[1];
        fVar53 = fVar115 - pfVar1[2];
        fVar60 = fVar116 - pfVar1[3];
        pfVar1 = (float *)(uVar30 + 0x90 + lVar23);
        local_af8 = *(undefined8 *)pfVar1;
        uStack_af0 = *(undefined8 *)(pfVar1 + 2);
        fVar104 = *pfVar1 - fVar121;
        fVar106 = pfVar1[1] - fVar122;
        fVar107 = pfVar1[2] - fVar123;
        fVar108 = pfVar1[3] - fVar124;
        pfVar3 = (float *)(uVar30 + 0xa0 + lVar23);
        uStack_a70 = *(undefined8 *)(pfVar3 + 2);
        fVar79 = *pfVar3 - fVar64;
        fVar80 = pfVar3[1] - fVar69;
        fVar81 = pfVar3[2] - fVar72;
        fVar82 = pfVar3[3] - fVar74;
        pfVar4 = (float *)(uVar30 + 0xb0 + lVar23);
        uStack_a80 = *(undefined8 *)(pfVar4 + 2);
        fVar83 = *pfVar4 - fVar113;
        fVar84 = pfVar4[1] - fVar114;
        fVar85 = pfVar4[2] - fVar115;
        fVar33 = pfVar4[3] - fVar116;
        local_9c8 = fVar37 * fVar79 - fVar93 * fVar83;
        fStack_9c4 = fVar41 * fVar80 - fVar95 * fVar84;
        fStack_9c0 = fVar53 * fVar81 - fVar97 * fVar85;
        fStack_9bc = fVar60 * fVar82 - fVar99 * fVar33;
        fStack_ae4 = *(float *)(ray + k * 4);
        fStack_ad4 = *(float *)(ray + k * 4 + 0x10);
        fVar65 = *(float *)(ray + k * 4 + 0x40);
        fVar70 = *(float *)(ray + k * 4 + 0x50);
        local_7e8 = fVar121 - fStack_ae4;
        fStack_7e4 = fVar122 - fStack_ae4;
        fStack_7e0 = fVar123 - fStack_ae4;
        fStack_7dc = fVar124 - fStack_ae4;
        fVar64 = fVar64 - fStack_ad4;
        fVar69 = fVar69 - fStack_ad4;
        fVar72 = fVar72 - fStack_ad4;
        fVar74 = fVar74 - fStack_ad4;
        fVar117 = local_7e8 * fVar70 - fVar64 * fVar65;
        fVar118 = fStack_7e4 * fVar70 - fVar69 * fVar65;
        fVar119 = fStack_7e0 * fVar70 - fVar72 * fVar65;
        fVar120 = fStack_7dc * fVar70 - fVar74 * fVar65;
        pfVar1 = (float *)(uVar30 + 0x30 + lVar23);
        local_b28 = *(undefined8 *)pfVar1;
        uStack_b20 = *(undefined8 *)(pfVar1 + 2);
        fVar121 = fVar121 - *pfVar1;
        fVar122 = fVar122 - pfVar1[1];
        fVar123 = fVar123 - pfVar1[2];
        fVar124 = fVar124 - pfVar1[3];
        fVar46 = fVar121 * fVar83 - fVar37 * fVar104;
        fVar56 = fVar122 * fVar84 - fVar41 * fVar106;
        fStack_aa0 = fVar123 * fVar85 - fVar53 * fVar107;
        fStack_a9c = fVar124 * fVar33 - fVar60 * fVar108;
        fStack_a90 = *(float *)(ray + k * 4 + 0x20);
        fVar78 = *(float *)(ray + k * 4 + 0x60);
        fVar113 = fVar113 - fStack_a90;
        fVar114 = fVar114 - fStack_a90;
        fVar115 = fVar115 - fStack_a90;
        fVar116 = fVar116 - fStack_a90;
        fVar89 = fVar113 * fVar65 - local_7e8 * fVar78;
        fVar90 = fVar114 * fVar65 - fStack_7e4 * fVar78;
        fVar91 = fVar115 * fVar65 - fStack_7e0 * fVar78;
        fVar92 = fVar116 * fVar65 - fStack_7dc * fVar78;
        local_9a8 = fVar93 * fVar104 - fVar121 * fVar79;
        fStack_9a4 = fVar95 * fVar106 - fVar122 * fVar80;
        fStack_9a0 = fVar97 * fVar107 - fVar123 * fVar81;
        fStack_99c = fVar99 * fVar108 - fVar124 * fVar82;
        fVar39 = fVar64 * fVar78 - fVar113 * fVar70;
        fVar43 = fVar69 * fVar78 - fVar114 * fVar70;
        fVar57 = fVar72 * fVar78 - fVar115 * fVar70;
        fVar88 = fVar74 * fVar78 - fVar116 * fVar70;
        local_aa8 = CONCAT44(fVar56,fVar46);
        fVar109 = local_9c8 * fVar65 + fVar46 * fVar70 + local_9a8 * fVar78;
        fVar110 = fStack_9c4 * fVar65 + fVar56 * fVar70 + fStack_9a4 * fVar78;
        fVar111 = fStack_9c0 * fVar65 + fStack_aa0 * fVar70 + fStack_9a0 * fVar78;
        fVar112 = fStack_9bc * fVar65 + fStack_a9c * fVar70 + fStack_99c * fVar78;
        uVar34 = (uint)fVar109 & 0x80000000;
        uVar38 = (uint)fVar110 & 0x80000000;
        uVar40 = (uint)fVar111 & 0x80000000;
        uVar42 = (uint)fVar112 & 0x80000000;
        local_a08 = (float)((uint)(fVar104 * fVar39 + fVar79 * fVar89 + fVar83 * fVar117) ^ uVar34);
        fStack_a04 = (float)((uint)(fVar106 * fVar43 + fVar80 * fVar90 + fVar84 * fVar118) ^ uVar38)
        ;
        fStack_a00 = (float)((uint)(fVar107 * fVar57 + fVar81 * fVar91 + fVar85 * fVar119) ^ uVar40)
        ;
        fStack_9fc = (float)((uint)(fVar108 * fVar88 + fVar82 * fVar92 + fVar33 * fVar120) ^ uVar42)
        ;
        local_9f8 = (float)((uint)(fVar39 * fVar121 + fVar89 * fVar93 + fVar117 * fVar37) ^ uVar34);
        fStack_9f4 = (float)((uint)(fVar43 * fVar122 + fVar90 * fVar95 + fVar118 * fVar41) ^ uVar38)
        ;
        fStack_9f0 = (float)((uint)(fVar57 * fVar123 + fVar91 * fVar97 + fVar119 * fVar53) ^ uVar40)
        ;
        fStack_9ec = (float)((uint)(fVar88 * fVar124 + fVar92 * fVar99 + fVar120 * fVar60) ^ uVar42)
        ;
        local_9d8._0_4_ = ABS(fVar109);
        local_9d8._4_4_ = ABS(fVar110);
        fStack_9d0 = ABS(fVar111);
        fStack_9cc = ABS(fVar112);
        bVar17 = ((0.0 <= local_9f8 && 0.0 <= local_a08) && fVar109 != 0.0) &&
                 local_a08 + local_9f8 <= (float)local_9d8._0_4_;
        bVar18 = ((0.0 <= fStack_9f4 && 0.0 <= fStack_a04) && fVar110 != 0.0) &&
                 fStack_a04 + fStack_9f4 <= (float)local_9d8._4_4_;
        bVar16 = ((0.0 <= fStack_9f0 && 0.0 <= fStack_a00) && fVar111 != 0.0) &&
                 fStack_a00 + fStack_9f0 <= fStack_9d0;
        bVar15 = ((0.0 <= fStack_9ec && 0.0 <= fStack_9fc) && fVar112 != 0.0) &&
                 fStack_9fc + fStack_9ec <= fStack_9cc;
        local_ab0 = (undefined1 (*) [16])(lVar23 + uVar30);
        auVar87._4_4_ = -(uint)bVar18;
        auVar87._0_4_ = -(uint)bVar17;
        auVar87._8_4_ = -(uint)bVar16;
        auVar87._12_4_ = -(uint)bVar15;
        iVar21 = movmskps((int)lVar23,auVar87);
        lVar23 = local_a98;
        pNVar28 = local_a78;
        uVar22 = local_a88;
        uVar19 = *(undefined8 *)pfVar4;
        uVar20 = *(undefined8 *)pfVar3;
        fVar121 = fStack_a90;
        if (iVar21 != 0) {
          local_9e8 = (float)(uVar34 ^ (uint)(local_7e8 * local_9c8 +
                                             fVar64 * fVar46 + fVar113 * local_9a8));
          fStack_9e4 = (float)(uVar38 ^ (uint)(fStack_7e4 * fStack_9c4 +
                                              fVar69 * fVar56 + fVar114 * fStack_9a4));
          fStack_9e0 = (float)(uVar40 ^ (uint)(fStack_7e0 * fStack_9c0 +
                                              fVar72 * fStack_aa0 + fVar115 * fStack_9a0));
          fStack_9dc = (float)(uVar42 ^ (uint)(fStack_7dc * fStack_9bc +
                                              fVar74 * fStack_a9c + fVar116 * fStack_99c));
          fVar121 = *(float *)(ray + k * 4 + 0x30);
          local_a68 = *(float *)(ray + k * 4 + 0x80);
          uStack_a64 = 0;
          uStack_a60 = 0;
          uStack_a5c = 0;
          local_998._0_4_ =
               -(uint)((fVar121 * (float)local_9d8._0_4_ < local_9e8 &&
                       local_9e8 <= local_a68 * (float)local_9d8._0_4_) && bVar17);
          local_998._4_4_ =
               -(uint)((fVar121 * (float)local_9d8._4_4_ < fStack_9e4 &&
                       fStack_9e4 <= local_a68 * (float)local_9d8._4_4_) && bVar18);
          local_998._8_4_ =
               -(uint)((fVar121 * fStack_9d0 < fStack_9e0 && fStack_9e0 <= local_a68 * fStack_9d0)
                      && bVar16);
          local_998._12_4_ =
               -(uint)((fVar121 * fStack_9cc < fStack_9dc && fStack_9dc <= local_a68 * fStack_9cc)
                      && bVar15);
          iVar21 = movmskps(iVar21,local_998);
          fVar121 = fStack_a90;
          if (iVar21 != 0) {
            local_9b8 = local_aa8;
            uStack_9b0 = CONCAT44(fStack_a9c,fStack_aa0);
            local_928._8_8_ = uStack_870;
            local_928._0_8_ = local_878;
            pSVar6 = context->scene;
            auVar14._4_4_ = local_9d8._4_4_;
            auVar14._0_4_ = local_9d8._0_4_;
            auVar14._8_4_ = fStack_9d0;
            auVar14._12_4_ = fStack_9cc;
            auVar50 = rcpps(local_998,auVar14);
            fVar65 = auVar50._0_4_;
            fVar70 = auVar50._4_4_;
            fVar121 = auVar50._8_4_;
            fVar122 = auVar50._12_4_;
            fVar123 = (float)DAT_01f7ba10;
            fVar124 = DAT_01f7ba10._4_4_;
            fVar64 = DAT_01f7ba10._12_4_;
            fVar78 = DAT_01f7ba10._8_4_;
            fVar65 = (fVar123 - (float)local_9d8._0_4_ * fVar65) * fVar65 + fVar65;
            fVar70 = (fVar124 - (float)local_9d8._4_4_ * fVar70) * fVar70 + fVar70;
            fVar121 = (fVar78 - fStack_9d0 * fVar121) * fVar121 + fVar121;
            fVar122 = (fVar64 - fStack_9cc * fVar122) * fVar122 + fVar122;
            local_968[0] = local_9e8 * fVar65;
            local_968[1] = fStack_9e4 * fVar70;
            local_968[2] = fStack_9e0 * fVar121;
            local_968[3] = fStack_9dc * fVar122;
            auVar105._0_4_ = local_a08 * fVar65;
            auVar105._4_4_ = fStack_a04 * fVar70;
            auVar105._8_4_ = fStack_a00 * fVar121;
            auVar105._12_4_ = fStack_9fc * fVar122;
            auVar87 = minps(auVar105,_DAT_01f7ba10);
            auVar47._0_4_ = fVar65 * local_9f8;
            auVar47._4_4_ = fVar70 * fStack_9f4;
            auVar47._8_4_ = fVar121 * fStack_9f0;
            auVar47._12_4_ = fVar122 * fStack_9ec;
            auVar50 = minps(auVar47,_DAT_01f7ba10);
            auVar66._0_4_ = fVar123 - auVar87._0_4_;
            auVar66._4_4_ = fVar124 - auVar87._4_4_;
            auVar66._8_4_ = fVar78 - auVar87._8_4_;
            auVar66._12_4_ = fVar64 - auVar87._12_4_;
            auVar76._0_4_ = fVar123 - auVar50._0_4_;
            auVar76._4_4_ = fVar124 - auVar50._4_4_;
            auVar76._8_4_ = fVar78 - auVar50._8_4_;
            auVar76._12_4_ = fVar64 - auVar50._12_4_;
            local_988 = blendvps(auVar87,auVar66,local_928);
            local_978 = blendvps(auVar50,auVar76,local_928);
            local_958[0] = local_9c8;
            local_958[1] = fStack_9c4;
            local_958[2] = fStack_9c0;
            local_958[3] = fStack_9bc;
            local_948 = local_aa8;
            uStack_940 = CONCAT44(fStack_a9c,fStack_aa0);
            local_938[0] = local_9a8;
            local_938[1] = fStack_9a4;
            local_938[2] = fStack_9a0;
            local_938[3] = fStack_99c;
            uVar22 = (ulong)(byte)iVar21;
            local_aa8 = lVar27;
            fStack_a8c = fStack_a90;
            do {
              uVar26 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              local_8b8 = *(uint *)(local_ab0[0xc] + uVar26 * 4);
              pGVar7 = (pSVar6->geometries).items[local_8b8].ptr;
              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00267ecd;
                local_8e8 = *(undefined4 *)(local_988 + uVar26 * 4);
                fVar65 = local_968[uVar26 - 4];
                *(float *)(ray + k * 4 + 0x80) = local_968[uVar26];
                args.context = context->user;
                uVar5 = *(undefined4 *)((long)&local_a18 + uVar26 * 4);
                local_8c8._4_4_ = uVar5;
                local_8c8._0_4_ = uVar5;
                local_8c8._8_4_ = uVar5;
                local_8c8._12_4_ = uVar5;
                local_8d8._4_4_ = fVar65;
                local_8d8._0_4_ = fVar65;
                local_8d8._8_4_ = fVar65;
                local_8d8._12_4_ = fVar65;
                local_918 = local_958[uVar26];
                local_908 = *(undefined4 *)((long)&local_948 + uVar26 * 4);
                local_8f8 = local_938[uVar26];
                fStack_914 = local_918;
                fStack_910 = local_918;
                fStack_90c = local_918;
                uStack_904 = local_908;
                uStack_900 = local_908;
                uStack_8fc = local_908;
                fStack_8f4 = local_8f8;
                fStack_8f0 = local_8f8;
                fStack_8ec = local_8f8;
                uStack_8e4 = local_8e8;
                uStack_8e0 = local_8e8;
                uStack_8dc = local_8e8;
                uStack_8b4 = local_8b8;
                uStack_8b0 = local_8b8;
                uStack_8ac = local_8b8;
                local_8a8 = (args.context)->instID[0];
                uStack_8a4 = local_8a8;
                uStack_8a0 = local_8a8;
                uStack_89c = local_8a8;
                local_898 = (args.context)->instPrimID[0];
                uStack_894 = local_898;
                uStack_890 = local_898;
                uStack_88c = local_898;
                local_ac8 = *local_a50;
                args.valid = (int *)local_ac8;
                args.geometryUserPtr = pGVar7->userPtr;
                args.hit = (RTCHitN *)&local_918;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar7->occlusionFilterN)(&args);
                }
                if (local_ac8 == (undefined1  [16])0x0) {
                  auVar48._8_4_ = 0xffffffff;
                  auVar48._0_8_ = 0xffffffffffffffff;
                  auVar48._12_4_ = 0xffffffff;
                  auVar48 = auVar48 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var8 = context->args->filter;
                  if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var8)(&args);
                  }
                  auVar35._0_4_ = -(uint)(local_ac8._0_4_ == 0);
                  auVar35._4_4_ = -(uint)(local_ac8._4_4_ == 0);
                  auVar35._8_4_ = -(uint)(local_ac8._8_4_ == 0);
                  auVar35._12_4_ = -(uint)(local_ac8._12_4_ == 0);
                  auVar48 = auVar35 ^ _DAT_01f7ae20;
                  auVar50 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar35);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar50;
                }
                if ((_DAT_01f7bb20 & auVar48) != (undefined1  [16])0x0) goto LAB_00267ecd;
                *(float *)(ray + k * 4 + 0x80) = local_a68;
              }
              uVar22 = uVar22 ^ 1L << (uVar26 & 0x3f);
            } while (uVar22 != 0);
            local_b28 = *(undefined8 *)local_ab0[3];
            uStack_b20 = *(undefined8 *)(local_ab0[3] + 8);
            local_b08 = *(undefined8 *)local_ab0[4];
            uStack_b00 = *(undefined8 *)(local_ab0[4] + 8);
            local_b18 = *(undefined8 *)local_ab0[5];
            uStack_b10 = *(undefined8 *)(local_ab0[5] + 8);
            local_af8 = *(undefined8 *)local_ab0[9];
            uStack_af0 = *(undefined8 *)(local_ab0[9] + 8);
            uStack_a70 = *(undefined8 *)(local_ab0[10] + 8);
            uStack_a80 = *(undefined8 *)(local_ab0[0xb] + 8);
            fStack_ae4 = *(float *)(ray + k * 4);
            fStack_ad4 = *(float *)(ray + k * 4 + 0x10);
            fVar65 = *(float *)(ray + k * 4 + 0x40);
            fVar70 = *(float *)(ray + k * 4 + 0x50);
            fVar78 = *(float *)(ray + k * 4 + 0x60);
            iVar21 = 0;
            lVar23 = local_a98;
            lVar27 = local_aa8;
            pNVar28 = local_a78;
            uVar22 = local_a88;
            uVar19 = *(undefined8 *)local_ab0[0xb];
            uVar20 = *(undefined8 *)local_ab0[10];
            fVar121 = *(float *)(ray + k * 4 + 0x20);
          }
        }
        local_a98._4_4_ = fVar121;
        local_a78 = (NodeRef *)uVar20;
        local_a88 = uVar19;
        local_aa8 = lVar27;
        fVar121 = *(float *)local_ab0[6];
        fVar122 = *(float *)(local_ab0[6] + 4);
        fVar123 = *(float *)(local_ab0[6] + 8);
        fVar124 = *(float *)(local_ab0[6] + 0xc);
        fVar64 = *(float *)local_ab0[7];
        fVar69 = *(float *)(local_ab0[7] + 4);
        fVar72 = *(float *)(local_ab0[7] + 8);
        fVar74 = *(float *)(local_ab0[7] + 0xc);
        fVar113 = *(float *)local_ab0[8];
        fVar114 = *(float *)(local_ab0[8] + 4);
        fVar115 = *(float *)(local_ab0[8] + 8);
        fVar116 = *(float *)(local_ab0[8] + 0xc);
        local_af8._0_4_ = fVar121 - (float)local_af8;
        local_af8._4_4_ = fVar122 - local_af8._4_4_;
        uStack_af0._0_4_ = fVar123 - (float)uStack_af0;
        uStack_af0._4_4_ = fVar124 - uStack_af0._4_4_;
        local_a78._0_4_ = fVar64 - (float)local_a78;
        local_a78._4_4_ = fVar69 - local_a78._4_4_;
        fVar33 = fVar72 - (float)uStack_a70;
        fVar39 = fVar74 - uStack_a70._4_4_;
        local_a88._0_4_ = fVar113 - (float)local_a88;
        local_a88._4_4_ = fVar114 - local_a88._4_4_;
        fVar57 = fVar115 - (float)uStack_a80;
        fVar88 = fVar116 - uStack_a80._4_4_;
        local_b28._0_4_ = (float)local_b28 - fVar121;
        local_b28._4_4_ = local_b28._4_4_ - fVar122;
        uStack_b20._0_4_ = (float)uStack_b20 - fVar123;
        uStack_b20._4_4_ = uStack_b20._4_4_ - fVar124;
        local_b08._0_4_ = (float)local_b08 - fVar64;
        local_b08._4_4_ = local_b08._4_4_ - fVar69;
        uStack_b00._0_4_ = (float)uStack_b00 - fVar72;
        uStack_b00._4_4_ = uStack_b00._4_4_ - fVar74;
        local_b18._0_4_ = (float)local_b18 - fVar113;
        local_b18._4_4_ = local_b18._4_4_ - fVar114;
        uStack_b10._0_4_ = (float)uStack_b10 - fVar115;
        uStack_b10._4_4_ = uStack_b10._4_4_ - fVar116;
        fVar121 = fVar121 - fStack_ae4;
        fVar122 = fVar122 - fStack_ae4;
        fVar123 = fVar123 - fStack_ae4;
        fVar124 = fVar124 - fStack_ae4;
        fVar113 = fVar113 - local_a98._4_4_;
        fVar114 = fVar114 - local_a98._4_4_;
        fVar115 = fVar115 - local_a98._4_4_;
        fVar116 = fVar116 - local_a98._4_4_;
        fVar90 = fVar113 * fVar65 - fVar121 * fVar78;
        fVar91 = fVar114 * fVar65 - fVar122 * fVar78;
        fVar92 = fVar115 * fVar65 - fVar123 * fVar78;
        fVar93 = fVar116 * fVar65 - fVar124 * fVar78;
        local_9c8 = (float)local_a88 * (float)local_b08 - (float)local_a78 * (float)local_b18;
        fStack_9c4 = local_a88._4_4_ * local_b08._4_4_ - local_a78._4_4_ * local_b18._4_4_;
        fStack_9c0 = fVar57 * (float)uStack_b00 - fVar33 * (float)uStack_b10;
        fStack_9bc = fVar88 * uStack_b00._4_4_ - fVar39 * uStack_b10._4_4_;
        fVar64 = fVar64 - fStack_ad4;
        fVar69 = fVar69 - fStack_ad4;
        fVar72 = fVar72 - fStack_ad4;
        fVar74 = fVar74 - fStack_ad4;
        fVar46 = fVar121 * fVar70 - fVar64 * fVar65;
        fVar56 = fVar122 * fVar70 - fVar69 * fVar65;
        fVar79 = fVar123 * fVar70 - fVar72 * fVar65;
        fVar80 = fVar124 * fVar70 - fVar74 * fVar65;
        fVar84 = (float)local_af8 * (float)local_b18 - (float)local_a88 * (float)local_b28;
        fVar85 = local_af8._4_4_ * local_b18._4_4_ - local_a88._4_4_ * local_b28._4_4_;
        fVar37 = (float)uStack_af0 * (float)uStack_b10 - fVar57 * (float)uStack_b20;
        fVar41 = uStack_af0._4_4_ * uStack_b10._4_4_ - fVar88 * uStack_b20._4_4_;
        local_9a8 = (float)local_a78 * (float)local_b28 - (float)local_af8 * (float)local_b08;
        fStack_9a4 = local_a78._4_4_ * local_b28._4_4_ - local_af8._4_4_ * local_b08._4_4_;
        fStack_9a0 = fVar33 * (float)uStack_b20 - (float)uStack_af0 * (float)uStack_b00;
        fStack_99c = fVar39 * uStack_b20._4_4_ - uStack_af0._4_4_ * uStack_b00._4_4_;
        fVar43 = fVar64 * fVar78 - fVar113 * fVar70;
        fVar53 = fVar69 * fVar78 - fVar114 * fVar70;
        fVar60 = fVar72 * fVar78 - fVar115 * fVar70;
        fVar89 = fVar74 * fVar78 - fVar116 * fVar70;
        fVar81 = fVar65 * local_9c8 + fVar70 * fVar84 + fVar78 * local_9a8;
        fVar82 = fVar65 * fStack_9c4 + fVar70 * fVar85 + fVar78 * fStack_9a4;
        fVar83 = fVar65 * fStack_9c0 + fVar70 * fVar37 + fVar78 * fStack_9a0;
        fVar78 = fVar65 * fStack_9bc + fVar70 * fVar41 + fVar78 * fStack_99c;
        uVar34 = (uint)fVar81 & 0x80000000;
        uVar38 = (uint)fVar82 & 0x80000000;
        uVar40 = (uint)fVar83 & 0x80000000;
        uVar42 = (uint)fVar78 & 0x80000000;
        local_a08 = (float)((uint)((float)local_b28 * fVar43 +
                                  (float)local_b08 * fVar90 + (float)local_b18 * fVar46) ^ uVar34);
        fStack_a04 = (float)((uint)(local_b28._4_4_ * fVar53 +
                                   local_b08._4_4_ * fVar91 + local_b18._4_4_ * fVar56) ^ uVar38);
        fStack_a00 = (float)((uint)((float)uStack_b20 * fVar60 +
                                   (float)uStack_b00 * fVar92 + (float)uStack_b10 * fVar79) ^ uVar40
                            );
        fStack_9fc = (float)((uint)(uStack_b20._4_4_ * fVar89 +
                                   uStack_b00._4_4_ * fVar93 + uStack_b10._4_4_ * fVar80) ^ uVar42);
        local_9f8 = (float)((uint)(fVar43 * (float)local_af8 +
                                  fVar90 * (float)local_a78 + fVar46 * (float)local_a88) ^ uVar34);
        fStack_9f4 = (float)((uint)(fVar53 * local_af8._4_4_ +
                                   fVar91 * local_a78._4_4_ + fVar56 * local_a88._4_4_) ^ uVar38);
        fStack_9f0 = (float)((uint)(fVar60 * (float)uStack_af0 + fVar92 * fVar33 + fVar79 * fVar57)
                            ^ uVar40);
        fStack_9ec = (float)((uint)(fVar89 * uStack_af0._4_4_ + fVar93 * fVar39 + fVar80 * fVar88) ^
                            uVar42);
        fVar65 = ABS(fVar81);
        fVar70 = ABS(fVar82);
        local_9d8 = (undefined1  [8])(CONCAT44(fVar82,fVar81) & 0x7fffffff7fffffff);
        fStack_9d0 = ABS(fVar83);
        fStack_9cc = ABS(fVar78);
        bVar16 = ((0.0 <= local_9f8 && 0.0 <= local_a08) && fVar81 != 0.0) &&
                 local_a08 + local_9f8 <= fVar65;
        auVar75._0_4_ = -(uint)bVar16;
        bVar18 = ((0.0 <= fStack_9f4 && 0.0 <= fStack_a04) && fVar82 != 0.0) &&
                 fStack_a04 + fStack_9f4 <= fVar70;
        auVar75._4_4_ = -(uint)bVar18;
        bVar17 = ((0.0 <= fStack_9f0 && 0.0 <= fStack_a00) && fVar83 != 0.0) &&
                 fStack_a00 + fStack_9f0 <= fStack_9d0;
        auVar75._8_4_ = -(uint)bVar17;
        bVar15 = ((0.0 <= fStack_9ec && 0.0 <= fStack_9fc) && fVar78 != 0.0) &&
                 fStack_9fc + fStack_9ec <= fStack_9cc;
        auVar75._12_4_ = -(uint)bVar15;
        iVar21 = movmskps(iVar21,auVar75);
        local_a78 = pNVar28;
        local_a88 = uVar22;
        if (iVar21 != 0) {
          local_9e8 = (float)(uVar34 ^ (uint)(fVar121 * local_9c8 +
                                             fVar64 * fVar84 + fVar113 * local_9a8));
          fStack_9e4 = (float)(uVar38 ^ (uint)(fVar122 * fStack_9c4 +
                                              fVar69 * fVar85 + fVar114 * fStack_9a4));
          fStack_9e0 = (float)(uVar40 ^ (uint)(fVar123 * fStack_9c0 +
                                              fVar72 * fVar37 + fVar115 * fStack_9a0));
          fStack_9dc = (float)(uVar42 ^ (uint)(fVar124 * fStack_9bc +
                                              fVar74 * fVar41 + fVar116 * fStack_99c));
          fVar78 = *(float *)(ray + k * 4 + 0x30);
          bVar9 = fVar78 * fVar65 < local_9e8;
          bVar10 = fVar78 * fVar70 < fStack_9e4;
          bVar11 = fVar78 * fStack_9d0 < fStack_9e0;
          bVar12 = fVar78 * fStack_9cc < fStack_9dc;
          auVar49._4_4_ = -(uint)bVar10;
          auVar49._0_4_ = -(uint)bVar9;
          auVar49._8_4_ = -(uint)bVar11;
          auVar49._12_4_ = -(uint)bVar12;
          local_a68 = *(float *)(ray + k * 4 + 0x80);
          uStack_a64 = 0;
          uStack_a60 = 0;
          uStack_a5c = 0;
          local_998._0_4_ = -(uint)((local_9e8 <= local_a68 * fVar65 && bVar9) && bVar16);
          local_998._4_4_ = -(uint)((fStack_9e4 <= local_a68 * fVar70 && bVar10) && bVar18);
          local_998._8_4_ = -(uint)((fStack_9e0 <= local_a68 * fStack_9d0 && bVar11) && bVar17);
          local_998._12_4_ = -(uint)((fStack_9dc <= local_a68 * fStack_9cc && bVar12) && bVar15);
          auVar13._4_4_ = local_998._4_4_;
          auVar13._0_4_ = local_998._0_4_;
          auVar13._8_4_ = local_998._8_4_;
          auVar13._12_4_ = local_998._12_4_;
          uVar34 = movmskps(iVar21,auVar13);
          if (uVar34 != 0) {
            local_9b8 = CONCAT44(fVar85,fVar84);
            uStack_9b0 = CONCAT44(fVar41,fVar37);
            local_928 = local_888;
            pSVar6 = context->scene;
            auVar50 = rcpps(auVar49,_local_9d8);
            fVar78 = auVar50._0_4_;
            fVar121 = auVar50._4_4_;
            fVar122 = auVar50._8_4_;
            fVar123 = auVar50._12_4_;
            fVar64 = (float)DAT_01f7ba10;
            fVar69 = DAT_01f7ba10._4_4_;
            fVar72 = DAT_01f7ba10._12_4_;
            fVar124 = DAT_01f7ba10._8_4_;
            fVar78 = (fVar64 - fVar65 * fVar78) * fVar78 + fVar78;
            fVar121 = (fVar69 - fVar70 * fVar121) * fVar121 + fVar121;
            fVar122 = (fVar124 - fStack_9d0 * fVar122) * fVar122 + fVar122;
            fVar123 = (fVar72 - fStack_9cc * fVar123) * fVar123 + fVar123;
            local_968[0] = local_9e8 * fVar78;
            local_968[1] = fStack_9e4 * fVar121;
            local_968[2] = fStack_9e0 * fVar122;
            local_968[3] = fStack_9dc * fVar123;
            auVar86._0_4_ = local_a08 * fVar78;
            auVar86._4_4_ = fStack_a04 * fVar121;
            auVar86._8_4_ = fStack_a00 * fVar122;
            auVar86._12_4_ = fStack_9fc * fVar123;
            auVar87 = minps(auVar86,_DAT_01f7ba10);
            auVar77._0_4_ = fVar78 * local_9f8;
            auVar77._4_4_ = fVar121 * fStack_9f4;
            auVar77._8_4_ = fVar122 * fStack_9f0;
            auVar77._12_4_ = fVar123 * fStack_9ec;
            auVar50 = minps(auVar77,_DAT_01f7ba10);
            auVar51._0_4_ = fVar64 - auVar87._0_4_;
            auVar51._4_4_ = fVar69 - auVar87._4_4_;
            auVar51._8_4_ = fVar124 - auVar87._8_4_;
            auVar51._12_4_ = fVar72 - auVar87._12_4_;
            auVar67._0_4_ = fVar64 - auVar50._0_4_;
            auVar67._4_4_ = fVar69 - auVar50._4_4_;
            auVar67._8_4_ = fVar124 - auVar50._8_4_;
            auVar67._12_4_ = fVar72 - auVar50._12_4_;
            local_988 = blendvps(auVar87,auVar51,local_888);
            local_978 = blendvps(auVar50,auVar67,local_888);
            local_958[0] = local_9c8;
            local_958[1] = fStack_9c4;
            local_958[2] = fStack_9c0;
            local_958[3] = fStack_9bc;
            local_948 = CONCAT44(fVar85,fVar84);
            uStack_940 = CONCAT44(fVar41,fVar37);
            local_938[0] = local_9a8;
            local_938[1] = fStack_9a4;
            local_938[2] = fStack_9a0;
            local_938[3] = fStack_99c;
            uVar22 = (ulong)(uVar34 & 0xff);
            fStack_a90 = local_a98._4_4_;
            fStack_a8c = local_a98._4_4_;
            do {
              local_a98 = lVar23;
              uVar26 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              local_8b8 = *(uint *)(local_ab0[0xc] + uVar26 * 4);
              pGVar7 = (pSVar6->geometries).items[local_8b8].ptr;
              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00267ecd:
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  return bVar32;
                }
                local_8e8 = *(undefined4 *)(local_988 + uVar26 * 4);
                fVar65 = local_968[uVar26 - 4];
                *(float *)(ray + k * 4 + 0x80) = local_968[uVar26];
                args.context = context->user;
                uVar5 = *(undefined4 *)((long)&local_a18 + uVar26 * 4);
                local_8c8._4_4_ = uVar5;
                local_8c8._0_4_ = uVar5;
                local_8c8._8_4_ = uVar5;
                local_8c8._12_4_ = uVar5;
                local_8d8._4_4_ = fVar65;
                local_8d8._0_4_ = fVar65;
                local_8d8._8_4_ = fVar65;
                local_8d8._12_4_ = fVar65;
                local_918 = local_958[uVar26];
                local_908 = *(undefined4 *)((long)&local_948 + uVar26 * 4);
                local_8f8 = local_938[uVar26];
                fStack_914 = local_918;
                fStack_910 = local_918;
                fStack_90c = local_918;
                uStack_904 = local_908;
                uStack_900 = local_908;
                uStack_8fc = local_908;
                fStack_8f4 = local_8f8;
                fStack_8f0 = local_8f8;
                fStack_8ec = local_8f8;
                uStack_8e4 = local_8e8;
                uStack_8e0 = local_8e8;
                uStack_8dc = local_8e8;
                uStack_8b4 = local_8b8;
                uStack_8b0 = local_8b8;
                uStack_8ac = local_8b8;
                local_8a8 = (args.context)->instID[0];
                uStack_8a4 = local_8a8;
                uStack_8a0 = local_8a8;
                uStack_89c = local_8a8;
                local_898 = (args.context)->instPrimID[0];
                uStack_894 = local_898;
                uStack_890 = local_898;
                uStack_88c = local_898;
                local_ac8 = *local_a50;
                args.valid = (int *)local_ac8;
                args.geometryUserPtr = pGVar7->userPtr;
                args.hit = (RTCHitN *)&local_918;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar7->occlusionFilterN)(&args);
                }
                if (local_ac8 == (undefined1  [16])0x0) {
                  auVar52._8_4_ = 0xffffffff;
                  auVar52._0_8_ = 0xffffffffffffffff;
                  auVar52._12_4_ = 0xffffffff;
                  auVar52 = auVar52 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var8 = context->args->filter;
                  if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var8)(&args);
                  }
                  auVar36._0_4_ = -(uint)(local_ac8._0_4_ == 0);
                  auVar36._4_4_ = -(uint)(local_ac8._4_4_ == 0);
                  auVar36._8_4_ = -(uint)(local_ac8._8_4_ == 0);
                  auVar36._12_4_ = -(uint)(local_ac8._12_4_ == 0);
                  auVar52 = auVar36 ^ _DAT_01f7ae20;
                  auVar50 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar36);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar50;
                }
                if ((_DAT_01f7bb20 & auVar52) != (undefined1  [16])0x0) goto LAB_00267ecd;
                *(float *)(ray + k * 4 + 0x80) = local_a68;
              }
              uVar22 = uVar22 ^ 1L << (uVar26 & 0x3f);
              lVar23 = local_a98;
            } while (uVar22 != 0);
          }
        }
        lVar27 = local_aa8 + 1;
        local_a98 = lVar23;
      } while (lVar27 != lVar23);
    }
    bVar32 = local_a78 != stack;
    fVar65 = local_808;
    fVar70 = fStack_804;
    fVar78 = fStack_800;
    fVar121 = fStack_7fc;
    fVar122 = local_818;
    fVar123 = fStack_814;
    fVar124 = fStack_810;
    fVar64 = fStack_80c;
    fVar69 = local_828;
    fVar72 = fStack_824;
    fVar74 = fStack_820;
    fVar113 = fStack_81c;
    fVar114 = local_848;
    fVar115 = fStack_844;
    fVar116 = fStack_840;
    fVar46 = fStack_83c;
    iVar21 = local_858;
    iVar94 = iStack_854;
    iVar96 = iStack_850;
    iVar98 = iStack_84c;
    iVar100 = local_868;
    iVar101 = iStack_864;
    iVar102 = iStack_860;
    iVar103 = iStack_85c;
    fVar56 = local_7f8;
    fVar79 = fStack_7f4;
    fVar80 = fStack_7f0;
    fVar81 = fStack_7ec;
    fVar82 = local_838;
    fVar83 = fStack_834;
    fVar84 = fStack_830;
    fVar85 = fStack_82c;
    if (!bVar32) {
      return bVar32;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }